

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O2

void __thiscall
Assimp::IFC::anon_unknown_9::TrimmedCurve::SampleDiscrete
          (TrimmedCurve *this,TempMesh *out,IfcFloat a,IfcFloat b)

{
  double dVar1;
  element_type *peVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  
  bVar3 = Curve::InRange((Curve *)this,a);
  if (bVar3) {
    bVar3 = Curve::InRange((Curve *)this,b);
    if (bVar3) {
      dVar1 = (this->range).first;
      dVar4 = (this->range).second;
      bVar3 = this->agree_sense != false;
      if (bVar3) {
        dVar5 = a + dVar1;
      }
      else {
        dVar5 = dVar4 - a;
      }
      peVar2 = (this->base).super___shared_ptr<const_Assimp::IFC::Curve,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (bVar3) {
        dVar4 = dVar1 + b;
      }
      else {
        dVar4 = dVar4 - b;
      }
      (*peVar2->_vptr_Curve[7])(dVar5,dVar4,peVar2,out);
      return;
    }
  }
  __assert_fail("InRange(a) && InRange(b)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                ,0x188,
                "virtual void Assimp::IFC::(anonymous namespace)::TrimmedCurve::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
               );
}

Assistant:

void SampleDiscrete(TempMesh& out,IfcFloat a,IfcFloat b) const {
        ai_assert(InRange(a) && InRange(b));
        return base->SampleDiscrete(out,TrimParam(a),TrimParam(b));
    }